

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifTune.c
# Opt level: O1

Gia_Man_t * Ifn_ManStrFindCofactors(int nIns,Gia_Man_t *p)

{
  uint uVar1;
  char *__s;
  Gia_Obj_t *pGVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  Gia_Man_t *p_00;
  size_t sVar8;
  char *__dest;
  Gia_Obj_t *pGVar9;
  Vec_Int_t *pVVar10;
  Gia_Man_t *pGVar11;
  ulong uVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  
  uVar14 = 1 << ((byte)nIns & 0x1f);
  p_00 = Gia_ManStart(p->nObjs);
  __s = p->pName;
  if (__s == (char *)0x0) {
    __dest = (char *)0x0;
  }
  else {
    sVar8 = strlen(__s);
    __dest = (char *)malloc(sVar8 + 1);
    strcpy(__dest,__s);
  }
  p_00->pName = __dest;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  pVVar10 = p->vCis;
  if (0 < pVVar10->nSize) {
    lVar15 = 0;
    do {
      iVar6 = pVVar10->pArray[lVar15];
      if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) {
LAB_003bcbd5:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                      ,0x1af,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar2 = p->pObjs;
      if (pGVar2 == (Gia_Obj_t *)0x0) break;
      if (nIns <= lVar15) {
        pGVar9 = Gia_ManAppendObj(p_00);
        uVar12 = *(ulong *)pGVar9;
        *(ulong *)pGVar9 = uVar12 | 0x9fffffff;
        *(ulong *)pGVar9 =
             uVar12 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar3 = p_00->pObjs;
        if ((pGVar9 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar9)) {
LAB_003bcc32:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/gia.h"
                        ,0x1b7,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * -0x55555555);
        pGVar3 = p_00->pObjs;
        if ((pGVar9 < pGVar3) || (pGVar3 + p_00->nObjs <= pGVar9)) goto LAB_003bcc32;
        pGVar2[iVar6].Value = (int)((ulong)((long)pGVar9 - (long)pGVar3) >> 2) * 0x55555556;
      }
      lVar15 = lVar15 + 1;
      pVVar10 = p->vCis;
    } while (lVar15 < pVVar10->nSize);
  }
  if (nIns != 0x1f) {
    uVar5 = 1;
    if (1 < (int)uVar14) {
      uVar5 = uVar14;
    }
    uVar14 = 0;
    do {
      lVar15 = (long)p->vCis->nSize;
      if (0 < lVar15) {
        piVar4 = p->vCis->pArray;
        lVar13 = 0;
        do {
          iVar6 = piVar4[lVar13];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_003bcbd5;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (lVar13 < nIns) {
            p->pObjs[iVar6].Value = (uint)((uVar14 >> ((uint)lVar13 & 0x1f) & 1) != 0);
          }
          lVar13 = lVar13 + 1;
        } while (lVar15 != lVar13);
      }
      if (0 < p->nObjs) {
        lVar15 = 8;
        lVar13 = 0;
        do {
          pGVar2 = p->pObjs;
          if (pGVar2 == (Gia_Obj_t *)0x0) break;
          uVar12 = *(ulong *)((long)pGVar2 + lVar15 + -8);
          if ((uVar12 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar12) {
            uVar7 = *(uint *)((long)pGVar2 +
                             lVar15 + (ulong)(uint)((int)(uVar12 & 0x1fffffff) << 2) * -3);
            if (((int)uVar7 < 0) ||
               (uVar1 = *(uint *)((long)pGVar2 +
                                 lVar15 + (ulong)((uint)(uVar12 >> 0x1e) & 0x7ffffffc) * -3),
               (int)uVar1 < 0)) goto LAB_003bcbf4;
            iVar6 = Gia_ManHashAnd(p_00,uVar7 ^ (uint)(uVar12 >> 0x1d) & 1,
                                   uVar1 ^ (uint)(uVar12 >> 0x3d) & 1);
            *(int *)(&pGVar2->field_0x0 + lVar15) = iVar6;
          }
          lVar13 = lVar13 + 1;
          lVar15 = lVar15 + 0xc;
        } while (lVar13 < p->nObjs);
      }
      pVVar10 = p->vCos;
      uVar12 = (ulong)(uint)pVVar10->nSize;
      if (p->nRegs < pVVar10->nSize) {
        lVar15 = 0;
        do {
          if ((int)uVar12 <= lVar15) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                          ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar6 = pVVar10->pArray[lVar15];
          if (((long)iVar6 < 0) || (p->nObjs <= iVar6)) goto LAB_003bcbd5;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar2 = p->pObjs + iVar6;
          if ((int)pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].Value < 0) {
LAB_003bcbf4:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                          ,0xf5,"int Abc_LitNotCond(int, int)");
          }
          uVar7 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar2 >> 0x1d & 1 ^
                                       pGVar2[-(ulong)((uint)*(undefined8 *)pGVar2 & 0x1fffffff)].
                                       Value);
          pGVar2->Value = uVar7;
          lVar15 = lVar15 + 1;
          pVVar10 = p->vCos;
          uVar12 = (ulong)pVVar10->nSize;
        } while (lVar15 < (long)(uVar12 - (long)p->nRegs));
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar5);
  }
  pGVar11 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar11;
}

Assistant:

Gia_Man_t * Ifn_ManStrFindCofactors( int nIns, Gia_Man_t * p )
{
    Gia_Man_t * pNew, * pTemp; 
    Gia_Obj_t * pObj;
    int i, m, nMints = 1 << nIns;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        if ( i >= nIns )
            pObj->Value = Gia_ManAppendCi( pNew );
    for ( m = 0; m < nMints; m++ )
    {
        Gia_ManForEachCi( p, pObj, i )
            if ( i < nIns )
                pObj->Value = ((m >> i) & 1);
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachPo( p, pObj, i )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    }
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}